

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execMuluMusashi<(moira::Core)1,(moira::Instr)82,(moira::Mode)11,2>
          (Moira *this,u16 opcode)

{
  u32 uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar3 = (ulong)((opcode & 0xe00) >> 9);
  uVar1 = readI<(moira::Core)1,2>(this);
  prefetch<(moira::Core)1,4ull>(this);
  iVar2 = *(ushort *)((long)&(this->reg).field_3 + uVar3 * 4) * uVar1;
  (this->reg).sr.n = SUB41((uint)iVar2 >> 0x1f,0);
  (this->reg).sr.z = iVar2 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  *(int *)((long)&(this->reg).field_3 + uVar3 * 4) = iVar2;
  return;
}

Assistant:

void
Moira::execMuluMusashi(u16 opcode)
{
    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    readOp<C, M, Word>(src, &ea, &data);

    prefetch<C, POLL>();
    result = mulu<C>(data, readD<Word>(dst));

    if constexpr (I == Instr::MULU) { SYNC_68000(50); SYNC_68010(26); }
    if constexpr (I == Instr::MULS) { SYNC_68000(50); SYNC_68010(28); }

    writeD(dst, result);
}